

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OrderedStructurePatternMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedStructurePatternMemberSyntax,slang::syntax::PatternSyntax&>
          (BumpAllocator *this,PatternSyntax *args)

{
  OrderedStructurePatternMemberSyntax *this_00;
  PatternSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (OrderedStructurePatternMemberSyntax *)allocate(this,0x18,8);
  slang::syntax::OrderedStructurePatternMemberSyntax::OrderedStructurePatternMemberSyntax
            (this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }